

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.h
# Opt level: O3

size_t __thiscall wasm::PossibleContents::hash(PossibleContents *this)

{
  byte bVar1;
  long lVar2;
  undefined8 uVar3;
  size_t sVar4;
  ulong uVar5;
  Name NVar6;
  Literal local_40;
  hash<wasm::Literal> local_21;
  
  bVar1 = *(__index_type *)
           ((long)&(this->value).
                   super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
           + 0x18);
  uVar5 = (ulong)(char)bVar1;
  if (uVar5 < 5) {
    sVar4 = (size_t)bVar1;
    switch(sVar4) {
    case 1:
      getLiteral(&local_40,this);
      sVar4 = std::hash<wasm::Literal>::operator()(&local_21,&local_40);
      sVar4 = sVar4 + 0x9e3779b97f4a7c15 + (uVar5 >> 4) + uVar5 * 0x1000 ^ uVar5;
      wasm::Literal::~Literal(&local_40);
      break;
    case 2:
      NVar6 = getGlobal(this);
      sVar4 = (ulong)(NVar6.super_IString.str._M_str +
                     (uVar5 >> 4) + uVar5 * 0x1000 + -0x61c8864680b583eb) ^ uVar5;
      break;
    case 3:
      lVar2 = std::hash<wasm::Type>::operator()((hash<wasm::Type> *)&local_40,(Type *)this);
      uVar5 = lVar2 + 0x9e3779b97f4aac15U ^ 3;
      sVar4 = uVar5 * 0x1000 + -0x61c8864680b583eb +
              (lVar2 + 0x9e3779b97f4aac15U >> 4) +
              (ulong)*(uint *)((long)&(this->value).
                                      super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                      .
                                      super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                      .
                                      super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                      .
                                      super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                      .
                                      super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                      .
                                      super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                              + 8) ^ uVar5;
      break;
    case 4:
      sVar4 = 4;
    }
    return sVar4;
  }
  uVar3 = wasm::handle_unreachable
                    ("bad variant",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.h"
                     ,0x13b);
  wasm::Literal::~Literal(&local_40);
  _Unwind_Resume(uVar3);
}

Assistant:

size_t hash() const {
    // First hash the index of the variant, then add the internals for each.
    size_t ret = std::hash<size_t>()(value.index());
    if (isNone() || isMany()) {
      // Nothing to add.
    } else if (isLiteral()) {
      rehash(ret, getLiteral());
    } else if (isGlobal()) {
      rehash(ret, getGlobal());
    } else if (auto* coneType = std::get_if<ConeType>(&value)) {
      rehash(ret, coneType->type);
      rehash(ret, coneType->depth);
    } else {
      WASM_UNREACHABLE("bad variant");
    }
    return ret;
  }